

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_equation.hpp
# Opt level: O1

ostream * viennamath::operator<<
                    (ostream *stream,
                    ct_equation<viennamath::ct_variable<0UL>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>
                    *param_2)

{
  ostream *poVar1;
  ct_variable<0UL> local_13;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  local_12;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"ct_equation(",0xc);
  poVar1 = operator<<(stream,&local_13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  poVar1 = operator<<(poVar1,&local_12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, ct_equation<LHS, RHS> const & /*u*/)
  {
    stream << "ct_equation(" << LHS() << " = " << RHS() << ")";
    return stream;
  }